

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::
visit_string(basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
             *this,string_view_type *sv,semantic_tag tag,ser_context *context,error_code *ec)

{
  ulong uVar1;
  bool bVar2;
  reference pvVar3;
  size_t sVar4;
  basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_> *in_RCX;
  error_code *in_RSI;
  basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_> *in_RDI;
  semantic_tag unaff_retaddr;
  string_view_type *in_stack_00000008;
  basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_> *pbVar5;
  
  pbVar5 = in_RDI;
  bVar2 = std::
          vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                   *)in_RCX);
  if (!bVar2) {
    pvVar3 = std::
             vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                     *)in_RDI);
    bVar2 = encoding_context::is_array(pvVar3);
    if (bVar2) {
      begin_scalar_value(in_RCX);
    }
    pvVar3 = std::
             vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                     *)in_RDI);
    bVar2 = encoding_context::is_multi_line(pvVar3);
    if ((!bVar2) &&
       (uVar1 = in_RDI->column_,
       sVar4 = basic_json_encode_options<wchar_t>::line_length_limit(&in_RDI->options_),
       sVar4 <= uVar1)) {
      break_line(in_RDI);
    }
  }
  write_string((basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_> *
               )ec,in_stack_00000008,unaff_retaddr,(ser_context *)pbVar5,in_RSI);
  end_value(in_RDI);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context& context, std::error_code& ec) final
        {
            if (!stack_.empty()) 
            {
                if (stack_.back().is_array())
                {
                    begin_scalar_value();
                }
                if (!stack_.back().is_multi_line() && column_ >= options_.line_length_limit())
                {
                    break_line();
                }
            }
            
            write_string(sv, tag, context, ec);

            end_value();
            JSONCONS_VISITOR_RETURN;
        }